

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

void __thiscall
cmCTest::HandleScriptArguments
          (cmCTest *this,size_t *i,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool *SRArgumentSpecified)

{
  pointer pbVar1;
  pointer pcVar2;
  ulong uVar3;
  _Head_base<0UL,_cmCTest::Private_*,_false> _Var4;
  int iVar5;
  size_t sVar6;
  string arg;
  long *local_50 [2];
  long local_40 [2];
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pcVar2 = pbVar1[*i]._M_dataplus._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar2,pcVar2 + pbVar1[*i]._M_string_length);
  iVar5 = std::__cxx11::string::compare((char *)local_50);
  if (iVar5 == 0) {
LAB_0015769a:
    uVar3 = *i;
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (uVar3 < ((long)(args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
      _Var4._M_head_impl =
           (this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
      (_Var4._M_head_impl)->RunConfigurationScript = true;
      sVar6 = uVar3 + 1;
      *i = sVar6;
      if (*SRArgumentSpecified == false) {
        cmCTestScriptHandler::AddConfigurationScript
                  (&(_Var4._M_head_impl)->ScriptHandler,pbVar1[sVar6]._M_dataplus._M_p,false);
      }
    }
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)local_50);
    if (iVar5 == 0) goto LAB_0015769a;
  }
  iVar5 = std::__cxx11::string::compare((char *)local_50);
  if (iVar5 == 0) {
LAB_00157707:
    uVar3 = *i;
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (uVar3 < ((long)(args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
      *SRArgumentSpecified = true;
      _Var4._M_head_impl =
           (this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
      (_Var4._M_head_impl)->RunConfigurationScript = true;
      sVar6 = uVar3 + 1;
      *i = sVar6;
      cmCTestScriptHandler::AddConfigurationScript
                (&(_Var4._M_head_impl)->ScriptHandler,pbVar1[sVar6]._M_dataplus._M_p,true);
    }
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)local_50);
    if (iVar5 == 0) goto LAB_00157707;
  }
  iVar5 = std::__cxx11::string::compare((char *)local_50);
  if (iVar5 != 0) {
    iVar5 = std::__cxx11::string::compare((char *)local_50);
    if (iVar5 != 0) goto LAB_001577bb;
  }
  uVar3 = *i;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (uVar3 < ((long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
    _Var4._M_head_impl =
         (this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    (_Var4._M_head_impl)->RunConfigurationScript = true;
    sVar6 = uVar3 + 1;
    *i = sVar6;
    if (*SRArgumentSpecified == false) {
      cmCTestScriptHandler::AddConfigurationScript
                (&(_Var4._M_head_impl)->ScriptHandler,pbVar1[sVar6]._M_dataplus._M_p,true);
    }
  }
LAB_001577bb:
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return;
}

Assistant:

void cmCTest::HandleScriptArguments(size_t& i, std::vector<std::string>& args,
                                    bool& SRArgumentSpecified)
{
  std::string arg = args[i];
  if (this->CheckArgument(arg, "-SP", "--script-new-process") &&
      i < args.size() - 1) {
    this->Impl->RunConfigurationScript = true;
    i++;
    cmCTestScriptHandler* ch = this->GetScriptHandler();
    // -SR is an internal argument, -SP should be ignored when it is passed
    if (!SRArgumentSpecified) {
      ch->AddConfigurationScript(args[i].c_str(), false);
    }
  }

  if (this->CheckArgument(arg, "-SR", "--script-run") && i < args.size() - 1) {
    SRArgumentSpecified = true;
    this->Impl->RunConfigurationScript = true;
    i++;
    cmCTestScriptHandler* ch = this->GetScriptHandler();
    ch->AddConfigurationScript(args[i].c_str(), true);
  }

  if (this->CheckArgument(arg, "-S", "--script") && i < args.size() - 1) {
    this->Impl->RunConfigurationScript = true;
    i++;
    cmCTestScriptHandler* ch = this->GetScriptHandler();
    // -SR is an internal argument, -S should be ignored when it is passed
    if (!SRArgumentSpecified) {
      ch->AddConfigurationScript(args[i].c_str(), true);
    }
  }
}